

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ZSTD_DCtx *code;
  sbyte sVar5;
  bool local_72;
  bool local_71;
  U32 minShare;
  U32 shareLongOffsets;
  size_t seqHSize;
  int nbSeq;
  int usePrefetchDecoder;
  size_t litCSize;
  void *pvStack_48;
  ZSTD_longOffset_e isLongOffset;
  BYTE *ip;
  size_t sStack_38;
  int frame_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  
  pvStack_48 = src;
  ip._4_4_ = frame;
  sStack_38 = srcSize;
  srcSize_local = (size_t)src;
  src_local = (void *)dstCapacity;
  dstCapacity_local = (size_t)dst;
  dst_local = dctx;
  uVar2 = MEM_32bits();
  local_71 = false;
  if (uVar2 != 0) {
    local_72 = true;
    if (ip._4_4_ != 0) {
      uVar1 = *(ulong *)((long)dst_local + 0x74f0);
      uVar2 = MEM_32bits();
      sVar5 = 0x39;
      if (uVar2 != 0) {
        sVar5 = 0x19;
      }
      local_72 = (ulong)(1L << sVar5) < uVar1;
    }
    local_71 = local_72;
  }
  litCSize._4_4_ = (ZSTD_longOffset_e)local_71;
  if (sStack_38 < 0x20000) {
    _nbSeq = (ZSTD_DCtx *)
             ZSTD_decodeLiteralsBlock((ZSTD_DCtx *)dst_local,(void *)srcSize_local,sStack_38);
    uVar2 = ERR_isError((size_t)_nbSeq);
    if (uVar2 == 0) {
      pvStack_48 = (void *)((long)pvStack_48 + (long)(&_nbSeq->entropy + -1) + 0x6a7c);
      sStack_38 = sStack_38 - (long)_nbSeq;
      seqHSize._4_4_ = *(uint *)((long)dst_local + 0x75f4);
      code = (ZSTD_DCtx *)
             ZSTD_decodeSeqHeaders((ZSTD_DCtx *)dst_local,(int *)&seqHSize,pvStack_48,sStack_38);
      uVar2 = ERR_isError((size_t)code);
      dctx_local = code;
      if (uVar2 == 0) {
        pvStack_48 = (void *)((long)pvStack_48 + (long)(&code->entropy + -1) + 0x6a7c);
        sStack_38 = sStack_38 - (long)code;
        if ((dstCapacity_local == 0) && (0 < (int)seqHSize)) {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffba;
        }
        else {
          if ((seqHSize._4_4_ == 0) &&
             (((ip._4_4_ == 0 || (0x1000000 < *(ulong *)((long)dst_local + 0x74f0))) &&
              (8 < (int)seqHSize)))) {
            uVar2 = ZSTD_getLongOffsetsShare(*(ZSTD_seqSymbol **)((long)dst_local + 0x10));
            uVar3 = MEM_64bits();
            uVar4 = 0x14;
            if (uVar3 != 0) {
              uVar4 = 7;
            }
            seqHSize._4_4_ = (uint)(uVar4 <= uVar2);
          }
          *(undefined4 *)((long)dst_local + 0x75f4) = 0;
          if (seqHSize._4_4_ == 0) {
            dctx_local = (ZSTD_DCtx *)
                         ZSTD_decompressSequences
                                   ((ZSTD_DCtx *)dst_local,(void *)dstCapacity_local,
                                    (size_t)src_local,pvStack_48,sStack_38,(int)seqHSize,
                                    litCSize._4_4_,ip._4_4_);
          }
          else {
            dctx_local = (ZSTD_DCtx *)
                         ZSTD_decompressSequencesLong
                                   ((ZSTD_DCtx *)dst_local,(void *)dstCapacity_local,
                                    (size_t)src_local,pvStack_48,sStack_38,(int)seqHSize,
                                    litCSize._4_4_,ip._4_4_);
          }
        }
      }
    }
    else {
      dctx_local = _nbSeq;
    }
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong, "");

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

        RETURN_ERROR_IF(dst == NULL && nbSeq > 0, dstSize_tooSmall, "NULL not handled");

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset, frame);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset, frame);
#endif
    }
}